

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_read_filter_row_paeth_multibyte_pixel
               (png_row_infop row_info,png_bytep row,png_const_bytep prev_row)

{
  byte bVar1;
  png_size_t pVar2;
  uint uVar3;
  int iVar4;
  int local_5c;
  int local_58;
  int local_54;
  int p;
  int pc;
  int pb;
  int pa;
  int c;
  int b;
  int a_1;
  int a;
  png_bytep rp_end;
  byte *pbStack_20;
  uint bpp;
  png_const_bytep prev_row_local;
  png_bytep row_local;
  png_row_infop row_info_local;
  
  uVar3 = (int)(row_info->pixel_depth + 7) >> 3;
  pbStack_20 = prev_row;
  prev_row_local = row;
  while (prev_row_local < row + uVar3) {
    *prev_row_local = *prev_row_local + *pbStack_20;
    pbStack_20 = pbStack_20 + 1;
    prev_row_local = prev_row_local + 1;
  }
  pVar2 = row_info->rowbytes;
  while (prev_row_local < row + uVar3 + (pVar2 - uVar3)) {
    bVar1 = pbStack_20[-(ulong)uVar3];
    local_5c = (uint)*pbStack_20 - (uint)bVar1;
    iVar4 = (uint)prev_row_local[-(ulong)uVar3] - (uint)bVar1;
    local_54 = local_5c;
    if (local_5c < 0) {
      local_54 = -local_5c;
    }
    pc = local_54;
    local_58 = iVar4;
    if (iVar4 < 0) {
      local_58 = -iVar4;
    }
    if (local_5c + iVar4 < 0) {
      local_5c = -(local_5c + iVar4);
    }
    else {
      local_5c = local_5c + iVar4;
    }
    c._0_1_ = prev_row_local[-(ulong)uVar3];
    if (local_58 < local_54) {
      pc = local_58;
      c._0_1_ = *pbStack_20;
    }
    if (local_5c < pc) {
      c._0_1_ = bVar1;
    }
    *prev_row_local = *prev_row_local + (byte)c;
    pbStack_20 = pbStack_20 + 1;
    prev_row_local = prev_row_local + 1;
  }
  return;
}

Assistant:

static void
png_read_filter_row_paeth_multibyte_pixel(png_row_infop row_info, png_bytep row,
    png_const_bytep prev_row)
{
   unsigned int bpp = (row_info->pixel_depth + 7) >> 3;
   png_bytep rp_end = row + bpp;

   /* Process the first pixel in the row completely (this is the same as 'up'
    * because there is only one candidate predictor for the first row).
    */
   while (row < rp_end)
   {
      int a = *row + *prev_row++;
      *row++ = (png_byte)a;
   }

   /* Remainder */
   rp_end = rp_end + (row_info->rowbytes - bpp);

   while (row < rp_end)
   {
      int a, b, c, pa, pb, pc, p;

      c = *(prev_row - bpp);
      a = *(row - bpp);
      b = *prev_row++;

      p = b - c;
      pc = a - c;

#ifdef PNG_USE_ABS
      pa = abs(p);
      pb = abs(pc);
      pc = abs(p + pc);
#else
      pa = p < 0 ? -p : p;
      pb = pc < 0 ? -pc : pc;
      pc = (p + pc) < 0 ? -(p + pc) : p + pc;
#endif

      if (pb < pa)
      {
         pa = pb; a = b;
      }
      if (pc < pa) a = c;

      a += *row;
      *row++ = (png_byte)a;
   }
}